

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_loopfilter_sse2.c
# Opt level: O3

void aom_highbd_lpf_horizontal_14_dual_sse2
               (uint16_t *s,int pitch,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1,int bd)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined8 uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  bool bVar69;
  long lVar70;
  undefined1 (*pauVar71) [16];
  uint16_t *puVar72;
  undefined1 (*pauVar73) [16];
  undefined1 (*pauVar74) [16];
  bool bVar75;
  undefined1 (*pauVar76) [16];
  uint16_t *puVar77;
  undefined1 (*pauVar78) [16];
  long lVar79;
  undefined1 (*pauVar80) [16];
  undefined4 uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  ushort uVar88;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  ushort uVar97;
  short sVar98;
  short sVar99;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  undefined1 auVar106 [16];
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar112;
  short sVar113;
  short sVar114;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  short sVar128;
  short sVar129;
  short sVar130;
  short sVar131;
  short sVar132;
  short sVar133;
  short sVar134;
  short sVar135;
  undefined1 auVar111 [16];
  short sVar136;
  short sVar137;
  short sVar138;
  short sVar139;
  ushort uVar140;
  short sVar141;
  ushort uVar143;
  short sVar144;
  ushort uVar145;
  short sVar146;
  ushort uVar147;
  short sVar148;
  ushort uVar149;
  short sVar150;
  ushort uVar151;
  short sVar152;
  ushort uVar153;
  short sVar154;
  undefined1 auVar142 [16];
  ushort uVar155;
  short sVar156;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  ushort uVar159;
  short sVar160;
  ushort uVar164;
  short sVar165;
  ushort uVar166;
  short sVar167;
  ushort uVar168;
  short sVar169;
  ushort uVar170;
  short sVar171;
  ushort uVar172;
  short sVar173;
  ushort uVar174;
  short sVar175;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  ushort uVar176;
  undefined1 auVar163 [16];
  short sVar177;
  undefined1 auVar178 [16];
  ushort uVar179;
  short sVar180;
  ushort uVar187;
  short sVar188;
  ushort uVar189;
  short sVar190;
  ushort uVar191;
  short sVar192;
  ushort uVar193;
  short sVar194;
  ushort uVar195;
  short sVar196;
  ushort uVar197;
  short sVar198;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  ushort uVar199;
  undefined1 auVar186 [16];
  short sVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  short sVar203;
  short sVar204;
  short sVar206;
  short sVar207;
  short sVar208;
  short sVar209;
  short sVar210;
  short sVar211;
  short sVar212;
  short sVar213;
  short sVar214;
  short sVar215;
  short sVar216;
  short sVar217;
  undefined1 auVar205 [16];
  short sVar218;
  short sVar219;
  undefined1 auVar220 [16];
  __m128i flat2_p [6];
  short local_358;
  short sStack_356;
  short sStack_354;
  short sStack_352;
  short sStack_350;
  short sStack_34e;
  short sStack_34c;
  short sStack_34a;
  short local_348;
  short sStack_346;
  short sStack_344;
  short sStack_342;
  short sStack_340;
  short sStack_33e;
  short sStack_33c;
  short sStack_33a;
  short local_318;
  short sStack_316;
  short sStack_314;
  short sStack_312;
  short sStack_310;
  short sStack_30e;
  short sStack_30c;
  short sStack_30a;
  short local_308;
  short sStack_306;
  short sStack_304;
  short sStack_302;
  short sStack_300;
  short sStack_2fe;
  short sStack_2fc;
  short sStack_2fa;
  ushort local_2f8;
  ushort uStack_2f6;
  ushort uStack_2f4;
  ushort uStack_2f2;
  ushort uStack_2f0;
  ushort uStack_2ee;
  ushort uStack_2ec;
  ushort uStack_2ea;
  ushort local_2e8;
  ushort uStack_2e6;
  ushort uStack_2e4;
  ushort uStack_2e2;
  ushort uStack_2e0;
  ushort uStack_2de;
  ushort uStack_2dc;
  ushort uStack_2da;
  ushort local_2d8;
  ushort uStack_2d6;
  ushort uStack_2d4;
  ushort uStack_2d2;
  ushort uStack_2d0;
  ushort uStack_2ce;
  ushort uStack_2cc;
  ushort uStack_2ca;
  ushort local_2c8;
  ushort uStack_2c6;
  ushort uStack_2c4;
  ushort uStack_2c2;
  ushort uStack_2c0;
  ushort uStack_2be;
  ushort uStack_2bc;
  ushort uStack_2ba;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  short local_248;
  short sStack_246;
  short sStack_244;
  short sStack_242;
  short sStack_240;
  short sStack_23e;
  short sStack_23c;
  short sStack_23a;
  undefined1 local_238 [16];
  short local_228;
  short sStack_226;
  short sStack_224;
  short sStack_222;
  short sStack_220;
  short sStack_21e;
  short sStack_21c;
  short sStack_21a;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  short local_1d8;
  short sStack_1d6;
  short sStack_1d4;
  short sStack_1d2;
  short sStack_1d0;
  short sStack_1ce;
  short sStack_1cc;
  short sStack_1ca;
  undefined1 local_1c8 [16];
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short sStack_150;
  short sStack_14e;
  short sStack_14c;
  short sStack_14a;
  ushort local_f8;
  ushort uStack_f6;
  ushort uStack_f4;
  ushort uStack_f2;
  ushort uStack_f0;
  ushort uStack_ee;
  ushort uStack_ec;
  ushort uStack_ea;
  ushort local_e8;
  ushort uStack_e6;
  ushort uStack_e4;
  ushort uStack_e2;
  ushort uStack_e0;
  ushort uStack_de;
  ushort uStack_dc;
  ushort uStack_da;
  ushort local_d8;
  ushort uStack_d6;
  ushort uStack_d4;
  ushort uStack_d2;
  ushort uStack_d0;
  ushort uStack_ce;
  ushort uStack_cc;
  ushort uStack_ca;
  ushort local_c8;
  ushort uStack_c6;
  ushort uStack_c4;
  ushort uStack_c2;
  ushort uStack_c0;
  ushort uStack_be;
  ushort uStack_bc;
  ushort uStack_ba;
  ushort local_b8;
  ushort uStack_b6;
  ushort uStack_b4;
  ushort uStack_b2;
  ushort uStack_b0;
  ushort uStack_ae;
  ushort uStack_ac;
  ushort uStack_aa;
  ushort local_a8;
  ushort uStack_a6;
  ushort uStack_a4;
  ushort uStack_a2;
  ushort uStack_a0;
  ushort uStack_9e;
  ushort uStack_9c;
  ushort uStack_9a;
  ushort local_98;
  ushort uStack_96;
  ushort uStack_94;
  ushort uStack_92;
  ushort uStack_90;
  ushort uStack_8e;
  ushort uStack_8c;
  ushort uStack_8a;
  ushort local_88;
  ushort uStack_86;
  ushort uStack_84;
  ushort uStack_82;
  ushort uStack_80;
  ushort uStack_7e;
  ushort uStack_7c;
  ushort uStack_7a;
  ushort local_78;
  ushort uStack_76;
  ushort uStack_74;
  ushort uStack_72;
  ushort uStack_70;
  ushort uStack_6e;
  ushort uStack_6c;
  ushort uStack_6a;
  ushort local_68;
  ushort uStack_66;
  ushort uStack_64;
  ushort uStack_62;
  ushort uStack_60;
  ushort uStack_5e;
  ushort uStack_5c;
  ushort uStack_5a;
  ushort local_58;
  ushort uStack_56;
  ushort uStack_54;
  ushort uStack_52;
  ushort uStack_50;
  ushort uStack_4e;
  ushort uStack_4c;
  ushort uStack_4a;
  ushort local_48;
  ushort uStack_46;
  ushort uStack_44;
  ushort uStack_42;
  ushort uStack_40;
  ushort uStack_3e;
  ushort uStack_3c;
  ushort uStack_3a;
  
  lVar70 = (long)pitch;
  puVar77 = s + -lVar70;
  lVar79 = 0;
  puVar72 = s;
  do {
    uVar48 = *(undefined8 *)(puVar77 + 4);
    *(undefined8 *)(local_208 + lVar79) = *(undefined8 *)puVar77;
    *(undefined8 *)(local_208 + lVar79 + 8) = uVar48;
    uVar48 = *(undefined8 *)(puVar72 + 4);
    *(undefined8 *)(local_278 + lVar79) = *(undefined8 *)puVar72;
    *(undefined8 *)(local_278 + lVar79 + 8) = uVar48;
    lVar79 = lVar79 + 0x10;
    puVar72 = puVar72 + lVar70;
    puVar77 = puVar77 + -lVar70;
  } while (lVar79 != 0x70);
  auVar89 = *(undefined1 (*) [16])_blimit0;
  auVar85 = *(undefined1 (*) [16])_blimit1;
  auVar6[0xd] = 0;
  auVar6._0_13_ = auVar89._0_13_;
  auVar6[0xe] = auVar89[7];
  auVar12[0xc] = auVar89[6];
  auVar12._0_12_ = auVar89._0_12_;
  auVar12._13_2_ = auVar6._13_2_;
  auVar18[0xb] = 0;
  auVar18._0_11_ = auVar89._0_11_;
  auVar18._12_3_ = auVar12._12_3_;
  auVar24[10] = auVar89[5];
  auVar24._0_10_ = auVar89._0_10_;
  auVar24._11_4_ = auVar18._11_4_;
  auVar30[9] = 0;
  auVar30._0_9_ = auVar89._0_9_;
  auVar30._10_5_ = auVar24._10_5_;
  auVar36[8] = auVar89[4];
  auVar36._0_8_ = auVar89._0_8_;
  auVar36._9_6_ = auVar30._9_6_;
  auVar51._7_8_ = 0;
  auVar51._0_7_ = auVar36._8_7_;
  auVar57._1_8_ = SUB158(auVar51 << 0x40,7);
  auVar57[0] = auVar89[3];
  auVar57._9_6_ = 0;
  auVar58._1_10_ = SUB1510(auVar57 << 0x30,5);
  auVar58[0] = auVar89[2];
  auVar58._11_4_ = 0;
  auVar47._3_12_ = SUB1512(auVar58 << 0x20,3);
  auVar47[2] = auVar89[1];
  auVar47[1] = 0;
  auVar47[0] = auVar89[0];
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar85._0_13_;
  auVar1[0xe] = auVar85[7];
  auVar7[0xc] = auVar85[6];
  auVar7._0_12_ = auVar85._0_12_;
  auVar7._13_2_ = auVar1._13_2_;
  auVar13[0xb] = 0;
  auVar13._0_11_ = auVar85._0_11_;
  auVar13._12_3_ = auVar7._12_3_;
  auVar19[10] = auVar85[5];
  auVar19._0_10_ = auVar85._0_10_;
  auVar19._11_4_ = auVar13._11_4_;
  auVar25[9] = 0;
  auVar25._0_9_ = auVar85._0_9_;
  auVar25._10_5_ = auVar19._10_5_;
  auVar31[8] = auVar85[4];
  auVar31._0_8_ = auVar85._0_8_;
  auVar31._9_6_ = auVar25._9_6_;
  auVar52._7_8_ = 0;
  auVar52._0_7_ = auVar31._8_7_;
  auVar59._1_8_ = SUB158(auVar52 << 0x40,7);
  auVar59[0] = auVar85[3];
  auVar59._9_6_ = 0;
  auVar60._1_10_ = SUB1510(auVar59 << 0x30,5);
  auVar60[0] = auVar85[2];
  auVar60._11_4_ = 0;
  auVar37[2] = auVar85[1];
  auVar37._0_2_ = auVar85._0_2_;
  auVar37._3_12_ = SUB1512(auVar60 << 0x20,3);
  auVar42._2_13_ = auVar37._2_13_;
  auVar42._0_2_ = auVar85._0_2_ & 0xff;
  auVar89._0_8_ = auVar47._0_8_;
  auVar89._8_8_ = auVar42._0_8_;
  auVar83 = ZEXT416(bd - 8);
  auVar85 = psllw(auVar89,auVar83);
  auVar89 = *(undefined1 (*) [16])_limit0;
  auVar2[0xd] = 0;
  auVar2._0_13_ = auVar89._0_13_;
  auVar2[0xe] = auVar89[7];
  auVar8[0xc] = auVar89[6];
  auVar8._0_12_ = auVar89._0_12_;
  auVar8._13_2_ = auVar2._13_2_;
  auVar14[0xb] = 0;
  auVar14._0_11_ = auVar89._0_11_;
  auVar14._12_3_ = auVar8._12_3_;
  auVar20[10] = auVar89[5];
  auVar20._0_10_ = auVar89._0_10_;
  auVar20._11_4_ = auVar14._11_4_;
  auVar26[9] = 0;
  auVar26._0_9_ = auVar89._0_9_;
  auVar26._10_5_ = auVar20._10_5_;
  auVar32[8] = auVar89[4];
  auVar32._0_8_ = auVar89._0_8_;
  auVar32._9_6_ = auVar26._9_6_;
  auVar53._7_8_ = 0;
  auVar53._0_7_ = auVar32._8_7_;
  auVar61._1_8_ = SUB158(auVar53 << 0x40,7);
  auVar61[0] = auVar89[3];
  auVar61._9_6_ = 0;
  auVar62._1_10_ = SUB1510(auVar61 << 0x30,5);
  auVar62[0] = auVar89[2];
  auVar62._11_4_ = 0;
  auVar38[2] = auVar89[1];
  auVar38._0_2_ = auVar89._0_2_;
  auVar38._3_12_ = SUB1512(auVar62 << 0x20,3);
  auVar43._2_13_ = auVar38._2_13_;
  auVar43._0_2_ = auVar89._0_2_ & 0xff;
  auVar89 = *(undefined1 (*) [16])_limit1;
  auVar3[0xd] = 0;
  auVar3._0_13_ = auVar89._0_13_;
  auVar3[0xe] = auVar89[7];
  auVar9[0xc] = auVar89[6];
  auVar9._0_12_ = auVar89._0_12_;
  auVar9._13_2_ = auVar3._13_2_;
  auVar15[0xb] = 0;
  auVar15._0_11_ = auVar89._0_11_;
  auVar15._12_3_ = auVar9._12_3_;
  auVar21[10] = auVar89[5];
  auVar21._0_10_ = auVar89._0_10_;
  auVar21._11_4_ = auVar15._11_4_;
  auVar27[9] = 0;
  auVar27._0_9_ = auVar89._0_9_;
  auVar27._10_5_ = auVar21._10_5_;
  auVar33[8] = auVar89[4];
  auVar33._0_8_ = auVar89._0_8_;
  auVar33._9_6_ = auVar27._9_6_;
  auVar54._7_8_ = 0;
  auVar54._0_7_ = auVar33._8_7_;
  auVar63._1_8_ = SUB158(auVar54 << 0x40,7);
  auVar63[0] = auVar89[3];
  auVar63._9_6_ = 0;
  auVar64._1_10_ = SUB1510(auVar63 << 0x30,5);
  auVar64[0] = auVar89[2];
  auVar64._11_4_ = 0;
  auVar39[2] = auVar89[1];
  auVar39._0_2_ = auVar89._0_2_;
  auVar39._3_12_ = SUB1512(auVar64 << 0x20,3);
  auVar44._2_13_ = auVar39._2_13_;
  auVar44._0_2_ = auVar89._0_2_ & 0xff;
  auVar82._0_8_ = auVar43._0_8_;
  auVar82._8_8_ = auVar44._0_8_;
  auVar181 = psllw(auVar82,auVar83);
  auVar89 = *(undefined1 (*) [16])_thresh0;
  auVar4[0xd] = 0;
  auVar4._0_13_ = auVar89._0_13_;
  auVar4[0xe] = auVar89[7];
  auVar10[0xc] = auVar89[6];
  auVar10._0_12_ = auVar89._0_12_;
  auVar10._13_2_ = auVar4._13_2_;
  auVar16[0xb] = 0;
  auVar16._0_11_ = auVar89._0_11_;
  auVar16._12_3_ = auVar10._12_3_;
  auVar22[10] = auVar89[5];
  auVar22._0_10_ = auVar89._0_10_;
  auVar22._11_4_ = auVar16._11_4_;
  auVar28[9] = 0;
  auVar28._0_9_ = auVar89._0_9_;
  auVar28._10_5_ = auVar22._10_5_;
  auVar34[8] = auVar89[4];
  auVar34._0_8_ = auVar89._0_8_;
  auVar34._9_6_ = auVar28._9_6_;
  auVar55._7_8_ = 0;
  auVar55._0_7_ = auVar34._8_7_;
  auVar65._1_8_ = SUB158(auVar55 << 0x40,7);
  auVar65[0] = auVar89[3];
  auVar65._9_6_ = 0;
  auVar66._1_10_ = SUB1510(auVar65 << 0x30,5);
  auVar66[0] = auVar89[2];
  auVar66._11_4_ = 0;
  auVar40[2] = auVar89[1];
  auVar40._0_2_ = auVar89._0_2_;
  auVar40._3_12_ = SUB1512(auVar66 << 0x20,3);
  auVar45._2_13_ = auVar40._2_13_;
  auVar45._0_2_ = auVar89._0_2_ & 0xff;
  auVar89 = *(undefined1 (*) [16])_thresh1;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar89._0_13_;
  auVar5[0xe] = auVar89[7];
  auVar11[0xc] = auVar89[6];
  auVar11._0_12_ = auVar89._0_12_;
  auVar11._13_2_ = auVar5._13_2_;
  auVar17[0xb] = 0;
  auVar17._0_11_ = auVar89._0_11_;
  auVar17._12_3_ = auVar11._12_3_;
  auVar23[10] = auVar89[5];
  auVar23._0_10_ = auVar89._0_10_;
  auVar23._11_4_ = auVar17._11_4_;
  auVar29[9] = 0;
  auVar29._0_9_ = auVar89._0_9_;
  auVar29._10_5_ = auVar23._10_5_;
  auVar35[8] = auVar89[4];
  auVar35._0_8_ = auVar89._0_8_;
  auVar35._9_6_ = auVar29._9_6_;
  auVar56._7_8_ = 0;
  auVar56._0_7_ = auVar35._8_7_;
  auVar67._1_8_ = SUB158(auVar56 << 0x40,7);
  auVar67[0] = auVar89[3];
  auVar67._9_6_ = 0;
  auVar68._1_10_ = SUB1510(auVar67 << 0x30,5);
  auVar68[0] = auVar89[2];
  auVar68._11_4_ = 0;
  auVar41[2] = auVar89[1];
  auVar41._0_2_ = auVar89._0_2_;
  auVar41._3_12_ = SUB1512(auVar68 << 0x20,3);
  auVar46._2_13_ = auVar41._2_13_;
  auVar46._0_2_ = auVar89._0_2_ & 0xff;
  auVar182._0_8_ = auVar45._0_8_;
  auVar182._8_8_ = auVar46._0_8_;
  auVar82 = ZEXT416((uint)(1 << ((char)bd - 1U & 0x1f)));
  auVar89 = psubusw(local_208,local_278);
  auVar111 = psubusw(local_278,local_208);
  auVar90 = psubusw(local_1f8,local_268);
  auVar142 = psubusw(local_268,local_1f8);
  auVar142 = auVar142 | auVar90;
  auVar89 = paddusw(auVar111 | auVar89,auVar111 | auVar89);
  auVar90._0_2_ = auVar142._0_2_ >> 1;
  auVar90._2_2_ = auVar142._2_2_ >> 1;
  auVar90._4_2_ = auVar142._4_2_ >> 1;
  auVar90._6_2_ = auVar142._6_2_ >> 1;
  auVar90._8_2_ = auVar142._8_2_ >> 1;
  auVar90._10_2_ = auVar142._10_2_ >> 1;
  auVar90._12_2_ = auVar142._12_2_ >> 1;
  auVar90._14_2_ = auVar142._14_2_ >> 1;
  auVar89 = paddusw(auVar90,auVar89);
  auVar89 = auVar89 ^ _DAT_004d8ba0;
  auVar85 = auVar85 ^ _DAT_004d8ba0;
  auVar111._0_2_ = -(ushort)(auVar85._0_2_ < auVar89._0_2_);
  auVar111._2_2_ = -(ushort)(auVar85._2_2_ < auVar89._2_2_);
  auVar111._4_2_ = -(ushort)(auVar85._4_2_ < auVar89._4_2_);
  auVar111._6_2_ = -(ushort)(auVar85._6_2_ < auVar89._6_2_);
  auVar111._8_2_ = -(ushort)(auVar85._8_2_ < auVar89._8_2_);
  auVar111._10_2_ = -(ushort)(auVar85._10_2_ < auVar89._10_2_);
  auVar111._12_2_ = -(ushort)(auVar85._12_2_ < auVar89._12_2_);
  auVar111._14_2_ = -(ushort)(auVar85._14_2_ < auVar89._14_2_);
  auVar142 = paddusw(_DAT_005137c0,auVar181);
  auVar142 = auVar142 & auVar111;
  lVar79 = 0x10;
  auVar89 = local_278;
  auVar85 = local_208;
  do {
    auVar90 = *(undefined1 (*) [16])(local_208 + lVar79);
    auVar111 = psubusw(auVar90,auVar85);
    auVar85 = psubusw(auVar85,auVar90);
    auVar85 = auVar85 | auVar111;
    sVar98 = auVar142._0_2_;
    sVar99 = auVar85._0_2_;
    uVar88 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar142._2_2_;
    sVar99 = auVar85._2_2_;
    uVar91 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar142._4_2_;
    sVar99 = auVar85._4_2_;
    uVar92 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar142._6_2_;
    sVar99 = auVar85._6_2_;
    uVar93 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar142._8_2_;
    sVar99 = auVar85._8_2_;
    uVar94 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar142._10_2_;
    sVar99 = auVar85._10_2_;
    uVar95 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar142._12_2_;
    sVar99 = auVar85._12_2_;
    sVar100 = auVar85._14_2_;
    uVar96 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar142._14_2_;
    uVar97 = (ushort)(sVar100 < sVar98) * sVar98 | (ushort)(sVar100 >= sVar98) * sVar100;
    auVar85 = *(undefined1 (*) [16])(local_278 + lVar79);
    auVar111 = psubusw(auVar85,auVar89);
    auVar89 = psubusw(auVar89,auVar85);
    auVar89 = auVar89 | auVar111;
    sVar98 = auVar89._0_2_;
    auVar142._0_2_ = (sVar98 < (short)uVar88) * uVar88 | (ushort)(sVar98 >= (short)uVar88) * sVar98;
    sVar98 = auVar89._2_2_;
    auVar142._2_2_ = (sVar98 < (short)uVar91) * uVar91 | (ushort)(sVar98 >= (short)uVar91) * sVar98;
    sVar98 = auVar89._4_2_;
    auVar142._4_2_ = (sVar98 < (short)uVar92) * uVar92 | (ushort)(sVar98 >= (short)uVar92) * sVar98;
    sVar98 = auVar89._6_2_;
    auVar142._6_2_ = (sVar98 < (short)uVar93) * uVar93 | (ushort)(sVar98 >= (short)uVar93) * sVar98;
    sVar98 = auVar89._8_2_;
    auVar142._8_2_ = (sVar98 < (short)uVar94) * uVar94 | (ushort)(sVar98 >= (short)uVar94) * sVar98;
    sVar98 = auVar89._10_2_;
    auVar142._10_2_ = (sVar98 < (short)uVar95) * uVar95 | (ushort)(sVar98 >= (short)uVar95) * sVar98
    ;
    sVar98 = auVar89._12_2_;
    sVar99 = auVar89._14_2_;
    auVar142._12_2_ = (sVar98 < (short)uVar96) * uVar96 | (ushort)(sVar98 >= (short)uVar96) * sVar98
    ;
    auVar142._14_2_ = (sVar99 < (short)uVar97) * uVar97 | (ushort)(sVar99 >= (short)uVar97) * sVar99
    ;
    lVar79 = lVar79 + 0x10;
    auVar89 = auVar85;
    auVar85 = auVar90;
  } while (lVar79 != 0x40);
  auVar89 = pshuflw(auVar82,auVar82,0);
  uVar81 = auVar89._0_4_;
  auVar178._4_4_ = uVar81;
  auVar178._0_4_ = uVar81;
  auVar178._8_4_ = uVar81;
  auVar178._12_4_ = uVar81;
  auVar89 = psubusw(local_268,local_278);
  auVar85 = psubusw(local_278,local_268);
  auVar85 = auVar85 | auVar89;
  auVar89 = psubusw(local_1f8,local_208);
  auVar82 = psubusw(local_208,local_1f8);
  auVar82 = auVar82 | auVar89;
  sVar98 = auVar85._0_2_;
  sVar99 = auVar82._0_2_;
  auVar161._0_2_ = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
  sVar98 = auVar85._2_2_;
  sVar99 = auVar82._2_2_;
  auVar161._2_2_ = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
  sVar98 = auVar85._4_2_;
  sVar99 = auVar82._4_2_;
  auVar161._4_2_ = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
  sVar98 = auVar85._6_2_;
  sVar99 = auVar82._6_2_;
  auVar161._6_2_ = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
  sVar98 = auVar85._8_2_;
  sVar99 = auVar82._8_2_;
  auVar161._8_2_ = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
  sVar98 = auVar85._10_2_;
  sVar99 = auVar82._10_2_;
  auVar161._10_2_ = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
  sVar98 = auVar85._12_2_;
  sVar99 = auVar82._12_2_;
  sVar100 = auVar82._14_2_;
  auVar161._12_2_ = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
  sVar98 = auVar85._14_2_;
  auVar161._14_2_ = (ushort)(sVar100 < sVar98) * sVar98 | (ushort)(sVar100 >= sVar98) * sVar100;
  lVar79 = 0x20;
  auVar85 = auVar161;
  do {
    auVar82 = psubusw(local_208,*(undefined1 (*) [16])(local_208 + lVar79));
    auVar89 = psubusw(*(undefined1 (*) [16])(local_208 + lVar79),local_208);
    auVar89 = auVar89 | auVar82;
    sVar98 = auVar85._0_2_;
    sVar99 = auVar89._0_2_;
    uVar88 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar85._2_2_;
    sVar99 = auVar89._2_2_;
    uVar91 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar85._4_2_;
    sVar99 = auVar89._4_2_;
    uVar92 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar85._6_2_;
    sVar99 = auVar89._6_2_;
    uVar93 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar85._8_2_;
    sVar99 = auVar89._8_2_;
    uVar94 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar85._10_2_;
    sVar99 = auVar89._10_2_;
    uVar95 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar85._12_2_;
    sVar99 = auVar89._12_2_;
    sVar100 = auVar89._14_2_;
    uVar96 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar85._14_2_;
    uVar97 = (ushort)(sVar100 < sVar98) * sVar98 | (ushort)(sVar100 >= sVar98) * sVar100;
    auVar85 = psubusw(local_278,*(undefined1 (*) [16])(local_278 + lVar79));
    auVar89 = psubusw(*(undefined1 (*) [16])(local_278 + lVar79),local_278);
    auVar89 = auVar89 | auVar85;
    sVar98 = auVar89._0_2_;
    auVar85._0_2_ = (sVar98 < (short)uVar88) * uVar88 | (ushort)(sVar98 >= (short)uVar88) * sVar98;
    sVar98 = auVar89._2_2_;
    auVar85._2_2_ = (sVar98 < (short)uVar91) * uVar91 | (ushort)(sVar98 >= (short)uVar91) * sVar98;
    sVar98 = auVar89._4_2_;
    auVar85._4_2_ = (sVar98 < (short)uVar92) * uVar92 | (ushort)(sVar98 >= (short)uVar92) * sVar98;
    sVar98 = auVar89._6_2_;
    auVar85._6_2_ = (sVar98 < (short)uVar93) * uVar93 | (ushort)(sVar98 >= (short)uVar93) * sVar98;
    sVar98 = auVar89._8_2_;
    auVar85._8_2_ = (sVar98 < (short)uVar94) * uVar94 | (ushort)(sVar98 >= (short)uVar94) * sVar98;
    sVar98 = auVar89._10_2_;
    auVar85._10_2_ = (sVar98 < (short)uVar95) * uVar95 | (ushort)(sVar98 >= (short)uVar95) * sVar98;
    sVar98 = auVar89._12_2_;
    sVar99 = auVar89._14_2_;
    auVar85._12_2_ = (sVar98 < (short)uVar96) * uVar96 | (ushort)(sVar98 >= (short)uVar96) * sVar98;
    auVar85._14_2_ = (sVar99 < (short)uVar97) * uVar97 | (ushort)(sVar99 >= (short)uVar97) * sVar99;
    lVar79 = lVar79 + 0x10;
  } while (lVar79 != 0x40);
  auVar90 = psllw(auVar182,auVar83);
  auVar111 = psllw(_DAT_005137c0,auVar83);
  auVar89 = psubusw(local_238,local_278);
  auVar82 = psubusw(local_278,local_238);
  auVar82 = auVar82 | auVar89;
  auVar83 = psubusw(local_1c8,local_208);
  auVar89 = psubusw(local_208,local_1c8);
  auVar89 = auVar89 | auVar83;
  sVar98 = auVar82._0_2_;
  sVar99 = auVar89._0_2_;
  auVar83._0_2_ = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
  sVar98 = auVar82._2_2_;
  sVar99 = auVar89._2_2_;
  auVar83._2_2_ = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
  sVar98 = auVar82._4_2_;
  sVar99 = auVar89._4_2_;
  auVar83._4_2_ = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
  sVar98 = auVar82._6_2_;
  sVar99 = auVar89._6_2_;
  auVar83._6_2_ = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
  sVar98 = auVar82._8_2_;
  sVar99 = auVar89._8_2_;
  auVar83._8_2_ = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
  sVar98 = auVar82._10_2_;
  sVar99 = auVar89._10_2_;
  auVar83._10_2_ = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
  sVar98 = auVar82._12_2_;
  sVar99 = auVar89._12_2_;
  sVar100 = auVar89._14_2_;
  auVar83._12_2_ = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
  sVar98 = auVar82._14_2_;
  auVar83._14_2_ = (ushort)(sVar100 < sVar98) * sVar98 | (ushort)(sVar100 >= sVar98) * sVar100;
  lVar79 = 0x50;
  do {
    auVar82 = psubusw(local_208,*(undefined1 (*) [16])(local_208 + lVar79));
    auVar89 = psubusw(*(undefined1 (*) [16])(local_208 + lVar79),local_208);
    auVar89 = auVar89 | auVar82;
    sVar98 = auVar83._0_2_;
    sVar99 = auVar89._0_2_;
    uVar88 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar83._2_2_;
    sVar99 = auVar89._2_2_;
    uVar91 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar83._4_2_;
    sVar99 = auVar89._4_2_;
    uVar92 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar83._6_2_;
    sVar99 = auVar89._6_2_;
    uVar93 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar83._8_2_;
    sVar99 = auVar89._8_2_;
    uVar94 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar83._10_2_;
    sVar99 = auVar89._10_2_;
    uVar95 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar83._12_2_;
    sVar99 = auVar89._12_2_;
    sVar100 = auVar89._14_2_;
    uVar96 = (ushort)(sVar99 < sVar98) * sVar98 | (ushort)(sVar99 >= sVar98) * sVar99;
    sVar98 = auVar83._14_2_;
    uVar97 = (ushort)(sVar100 < sVar98) * sVar98 | (ushort)(sVar100 >= sVar98) * sVar100;
    auVar82 = psubusw(local_278,*(undefined1 (*) [16])(local_278 + lVar79));
    auVar89 = psubusw(*(undefined1 (*) [16])(local_278 + lVar79),local_278);
    auVar89 = auVar89 | auVar82;
    sVar98 = auVar89._0_2_;
    auVar83._0_2_ = (sVar98 < (short)uVar88) * uVar88 | (ushort)(sVar98 >= (short)uVar88) * sVar98;
    sVar98 = auVar89._2_2_;
    auVar83._2_2_ = (sVar98 < (short)uVar91) * uVar91 | (ushort)(sVar98 >= (short)uVar91) * sVar98;
    sVar98 = auVar89._4_2_;
    auVar83._4_2_ = (sVar98 < (short)uVar92) * uVar92 | (ushort)(sVar98 >= (short)uVar92) * sVar98;
    sVar98 = auVar89._6_2_;
    auVar83._6_2_ = (sVar98 < (short)uVar93) * uVar93 | (ushort)(sVar98 >= (short)uVar93) * sVar98;
    sVar98 = auVar89._8_2_;
    auVar83._8_2_ = (sVar98 < (short)uVar94) * uVar94 | (ushort)(sVar98 >= (short)uVar94) * sVar98;
    sVar98 = auVar89._10_2_;
    auVar83._10_2_ = (sVar98 < (short)uVar95) * uVar95 | (ushort)(sVar98 >= (short)uVar95) * sVar98;
    sVar98 = auVar89._12_2_;
    sVar99 = auVar89._14_2_;
    auVar83._12_2_ = (sVar98 < (short)uVar96) * uVar96 | (ushort)(sVar98 >= (short)uVar96) * sVar98;
    auVar83._14_2_ = (sVar99 < (short)uVar97) * uVar97 | (ushort)(sVar99 >= (short)uVar97) * sVar99;
    lVar79 = lVar79 + 0x10;
  } while (lVar79 != 0x70);
  auVar89 = psubusw(auVar142,auVar181);
  auVar201._0_2_ = -(ushort)(auVar89._0_2_ == 0);
  auVar201._2_2_ = -(ushort)(auVar89._2_2_ == 0);
  auVar201._4_2_ = -(ushort)(auVar89._4_2_ == 0);
  auVar201._6_2_ = -(ushort)(auVar89._6_2_ == 0);
  auVar201._8_2_ = -(ushort)(auVar89._8_2_ == 0);
  auVar201._10_2_ = -(ushort)(auVar89._10_2_ == 0);
  auVar201._12_2_ = -(ushort)(auVar89._12_2_ == 0);
  auVar201._14_2_ = -(ushort)(auVar89._14_2_ == 0);
  auVar89 = psubusw(auVar85,auVar111);
  auVar181._0_2_ = -(ushort)(auVar89._0_2_ == 0);
  auVar181._2_2_ = -(ushort)(auVar89._2_2_ == 0);
  auVar181._4_2_ = -(ushort)(auVar89._4_2_ == 0);
  auVar181._6_2_ = -(ushort)(auVar89._6_2_ == 0);
  auVar181._8_2_ = -(ushort)(auVar89._8_2_ == 0);
  auVar181._10_2_ = -(ushort)(auVar89._10_2_ == 0);
  auVar181._12_2_ = -(ushort)(auVar89._12_2_ == 0);
  auVar181._14_2_ = -(ushort)(auVar89._14_2_ == 0);
  auVar205 = psubsw(local_208,auVar178);
  auVar220 = psubsw(local_1f8,auVar178);
  auVar85 = psubsw(local_278,auVar178);
  auVar142 = psubsw(local_268,auVar178);
  auVar89 = psllw(_DAT_005137c0,ZEXT416((uint)bd));
  auVar86._8_4_ = 0xffffffff;
  auVar86._0_8_ = 0xffffffffffffffff;
  auVar86._12_4_ = 0xffffffff;
  auVar89 = paddsw(auVar89,auVar86);
  auVar82 = psubsw(auVar89,auVar178);
  auVar89 = psubsw((undefined1  [16])0x0,auVar178);
  auVar90 = auVar90 ^ _DAT_004d8ba0;
  auVar161 = auVar161 ^ _DAT_004d8ba0;
  auVar182 = psubsw(auVar220,auVar142);
  sVar204 = auVar82._0_2_;
  sVar98 = auVar182._0_2_;
  uVar88 = (ushort)(sVar204 < sVar98) * sVar204 | (ushort)(sVar204 >= sVar98) * sVar98;
  sVar207 = auVar82._2_2_;
  sVar98 = auVar182._2_2_;
  uVar91 = (ushort)(sVar207 < sVar98) * sVar207 | (ushort)(sVar207 >= sVar98) * sVar98;
  sVar209 = auVar82._4_2_;
  sVar98 = auVar182._4_2_;
  uVar92 = (ushort)(sVar209 < sVar98) * sVar209 | (ushort)(sVar209 >= sVar98) * sVar98;
  sVar211 = auVar82._6_2_;
  sVar98 = auVar182._6_2_;
  uVar93 = (ushort)(sVar211 < sVar98) * sVar211 | (ushort)(sVar211 >= sVar98) * sVar98;
  sVar213 = auVar82._8_2_;
  sVar98 = auVar182._8_2_;
  uVar94 = (ushort)(sVar213 < sVar98) * sVar213 | (ushort)(sVar213 >= sVar98) * sVar98;
  sVar215 = auVar82._10_2_;
  sVar98 = auVar182._10_2_;
  uVar95 = (ushort)(sVar215 < sVar98) * sVar215 | (ushort)(sVar215 >= sVar98) * sVar98;
  sVar217 = auVar82._12_2_;
  sVar98 = auVar182._12_2_;
  sVar99 = auVar182._14_2_;
  uVar96 = (ushort)(sVar217 < sVar98) * sVar217 | (ushort)(sVar217 >= sVar98) * sVar98;
  sVar219 = auVar82._14_2_;
  uVar97 = (ushort)(sVar219 < sVar99) * sVar219 | (ushort)(sVar219 >= sVar99) * sVar99;
  sVar98 = auVar89._0_2_;
  auVar183._0_2_ = (ushort)((short)uVar88 < sVar98) * sVar98 | ((short)uVar88 >= sVar98) * uVar88;
  sVar99 = auVar89._2_2_;
  auVar183._2_2_ = (ushort)((short)uVar91 < sVar99) * sVar99 | ((short)uVar91 >= sVar99) * uVar91;
  sVar100 = auVar89._4_2_;
  auVar183._4_2_ = (ushort)((short)uVar92 < sVar100) * sVar100 | ((short)uVar92 >= sVar100) * uVar92
  ;
  sVar101 = auVar89._6_2_;
  auVar183._6_2_ = (ushort)((short)uVar93 < sVar101) * sVar101 | ((short)uVar93 >= sVar101) * uVar93
  ;
  sVar102 = auVar89._8_2_;
  auVar183._8_2_ = (ushort)((short)uVar94 < sVar102) * sVar102 | ((short)uVar94 >= sVar102) * uVar94
  ;
  sVar103 = auVar89._10_2_;
  auVar183._10_2_ =
       (ushort)((short)uVar95 < sVar103) * sVar103 | ((short)uVar95 >= sVar103) * uVar95;
  sVar104 = auVar89._12_2_;
  auVar183._12_2_ =
       (ushort)((short)uVar96 < sVar104) * sVar104 | ((short)uVar96 >= sVar104) * uVar96;
  sVar105 = auVar89._14_2_;
  auVar183._14_2_ =
       (ushort)((short)uVar97 < sVar105) * sVar105 | ((short)uVar97 >= sVar105) * uVar97;
  auVar162._0_2_ = -(ushort)(auVar90._0_2_ < auVar161._0_2_);
  auVar162._2_2_ = -(ushort)(auVar90._2_2_ < auVar161._2_2_);
  auVar162._4_2_ = -(ushort)(auVar90._4_2_ < auVar161._4_2_);
  auVar162._6_2_ = -(ushort)(auVar90._6_2_ < auVar161._6_2_);
  auVar162._8_2_ = -(ushort)(auVar90._8_2_ < auVar161._8_2_);
  auVar162._10_2_ = -(ushort)(auVar90._10_2_ < auVar161._10_2_);
  auVar162._12_2_ = -(ushort)(auVar90._12_2_ < auVar161._12_2_);
  auVar162._14_2_ = -(ushort)(auVar90._14_2_ < auVar161._14_2_);
  auVar89 = psubsw(auVar85,auVar205);
  auVar82 = paddsw(auVar183 & auVar162,auVar89);
  auVar82 = paddsw(auVar82,auVar89);
  auVar89 = paddsw(auVar82,auVar89);
  sVar107 = auVar89._0_2_;
  uVar88 = (ushort)(sVar204 < sVar107) * sVar204 | (ushort)(sVar204 >= sVar107) * sVar107;
  sVar107 = auVar89._2_2_;
  uVar91 = (ushort)(sVar207 < sVar107) * sVar207 | (ushort)(sVar207 >= sVar107) * sVar107;
  sVar107 = auVar89._4_2_;
  uVar92 = (ushort)(sVar209 < sVar107) * sVar209 | (ushort)(sVar209 >= sVar107) * sVar107;
  sVar107 = auVar89._6_2_;
  uVar93 = (ushort)(sVar211 < sVar107) * sVar211 | (ushort)(sVar211 >= sVar107) * sVar107;
  sVar107 = auVar89._8_2_;
  uVar94 = (ushort)(sVar213 < sVar107) * sVar213 | (ushort)(sVar213 >= sVar107) * sVar107;
  sVar107 = auVar89._10_2_;
  uVar95 = (ushort)(sVar215 < sVar107) * sVar215 | (ushort)(sVar215 >= sVar107) * sVar107;
  sVar107 = auVar89._12_2_;
  sVar108 = auVar89._14_2_;
  uVar96 = (ushort)(sVar217 < sVar107) * sVar217 | (ushort)(sVar217 >= sVar107) * sVar107;
  uVar97 = (ushort)(sVar219 < sVar108) * sVar219 | (ushort)(sVar219 >= sVar108) * sVar108;
  auVar184._0_2_ = (ushort)((short)uVar88 < sVar98) * sVar98 | ((short)uVar88 >= sVar98) * uVar88;
  auVar184._2_2_ = (ushort)((short)uVar91 < sVar99) * sVar99 | ((short)uVar91 >= sVar99) * uVar91;
  auVar184._4_2_ = (ushort)((short)uVar92 < sVar100) * sVar100 | ((short)uVar92 >= sVar100) * uVar92
  ;
  auVar184._6_2_ = (ushort)((short)uVar93 < sVar101) * sVar101 | ((short)uVar93 >= sVar101) * uVar93
  ;
  auVar184._8_2_ = (ushort)((short)uVar94 < sVar102) * sVar102 | ((short)uVar94 >= sVar102) * uVar94
  ;
  auVar184._10_2_ =
       (ushort)((short)uVar95 < sVar103) * sVar103 | ((short)uVar95 >= sVar103) * uVar95;
  auVar184._12_2_ =
       (ushort)((short)uVar96 < sVar104) * sVar104 | ((short)uVar96 >= sVar104) * uVar96;
  auVar184._14_2_ =
       (ushort)((short)uVar97 < sVar105) * sVar105 | ((short)uVar97 >= sVar105) * uVar97;
  auVar89 = paddsw(_DAT_00507960,auVar184 & auVar201);
  auVar82 = paddsw(auVar184 & auVar201,_DAT_005137e0);
  auVar181 = auVar181 & auVar201;
  sVar107 = auVar82._0_2_;
  uVar88 = (ushort)(sVar204 < sVar107) * sVar204 | (ushort)(sVar204 >= sVar107) * sVar107;
  sVar107 = auVar82._2_2_;
  uVar91 = (ushort)(sVar207 < sVar107) * sVar207 | (ushort)(sVar207 >= sVar107) * sVar107;
  sVar107 = auVar82._4_2_;
  uVar92 = (ushort)(sVar209 < sVar107) * sVar209 | (ushort)(sVar209 >= sVar107) * sVar107;
  sVar107 = auVar82._6_2_;
  uVar93 = (ushort)(sVar211 < sVar107) * sVar211 | (ushort)(sVar211 >= sVar107) * sVar107;
  sVar107 = auVar82._8_2_;
  uVar94 = (ushort)(sVar213 < sVar107) * sVar213 | (ushort)(sVar213 >= sVar107) * sVar107;
  sVar107 = auVar82._10_2_;
  uVar95 = (ushort)(sVar215 < sVar107) * sVar215 | (ushort)(sVar215 >= sVar107) * sVar107;
  sVar107 = auVar82._12_2_;
  sVar108 = auVar82._14_2_;
  uVar96 = (ushort)(sVar217 < sVar107) * sVar217 | (ushort)(sVar217 >= sVar107) * sVar107;
  uVar97 = (ushort)(sVar219 < sVar108) * sVar219 | (ushort)(sVar219 >= sVar108) * sVar108;
  auVar185._0_2_ = (ushort)((short)uVar88 < sVar98) * sVar98 | ((short)uVar88 >= sVar98) * uVar88;
  auVar185._2_2_ = (ushort)((short)uVar91 < sVar99) * sVar99 | ((short)uVar91 >= sVar99) * uVar91;
  auVar185._4_2_ = (ushort)((short)uVar92 < sVar100) * sVar100 | ((short)uVar92 >= sVar100) * uVar92
  ;
  auVar185._6_2_ = (ushort)((short)uVar93 < sVar101) * sVar101 | ((short)uVar93 >= sVar101) * uVar93
  ;
  auVar185._8_2_ = (ushort)((short)uVar94 < sVar102) * sVar102 | ((short)uVar94 >= sVar102) * uVar94
  ;
  auVar185._10_2_ =
       (ushort)((short)uVar95 < sVar103) * sVar103 | ((short)uVar95 >= sVar103) * uVar95;
  auVar185._12_2_ =
       (ushort)((short)uVar96 < sVar104) * sVar104 | ((short)uVar96 >= sVar104) * uVar96;
  auVar185._14_2_ =
       (ushort)((short)uVar97 < sVar105) * sVar105 | ((short)uVar97 >= sVar105) * uVar97;
  auVar82 = psraw(auVar185,3);
  auVar90 = paddsw(auVar82,auVar205);
  sVar107 = auVar89._0_2_;
  uVar88 = (ushort)(sVar204 < sVar107) * sVar204 | (ushort)(sVar204 >= sVar107) * sVar107;
  sVar107 = auVar89._2_2_;
  uVar91 = (ushort)(sVar207 < sVar107) * sVar207 | (ushort)(sVar207 >= sVar107) * sVar107;
  sVar107 = auVar89._4_2_;
  uVar92 = (ushort)(sVar209 < sVar107) * sVar209 | (ushort)(sVar209 >= sVar107) * sVar107;
  sVar107 = auVar89._6_2_;
  uVar93 = (ushort)(sVar211 < sVar107) * sVar211 | (ushort)(sVar211 >= sVar107) * sVar107;
  sVar107 = auVar89._8_2_;
  uVar94 = (ushort)(sVar213 < sVar107) * sVar213 | (ushort)(sVar213 >= sVar107) * sVar107;
  sVar107 = auVar89._10_2_;
  uVar95 = (ushort)(sVar215 < sVar107) * sVar215 | (ushort)(sVar215 >= sVar107) * sVar107;
  sVar107 = auVar89._12_2_;
  sVar108 = auVar89._14_2_;
  uVar96 = (ushort)(sVar217 < sVar107) * sVar217 | (ushort)(sVar217 >= sVar107) * sVar107;
  uVar97 = (ushort)(sVar219 < sVar108) * sVar219 | (ushort)(sVar219 >= sVar108) * sVar108;
  auVar157._0_2_ = (ushort)((short)uVar88 < sVar98) * sVar98 | ((short)uVar88 >= sVar98) * uVar88;
  auVar157._2_2_ = (ushort)((short)uVar91 < sVar99) * sVar99 | ((short)uVar91 >= sVar99) * uVar91;
  auVar157._4_2_ = (ushort)((short)uVar92 < sVar100) * sVar100 | ((short)uVar92 >= sVar100) * uVar92
  ;
  auVar157._6_2_ = (ushort)((short)uVar93 < sVar101) * sVar101 | ((short)uVar93 >= sVar101) * uVar93
  ;
  auVar157._8_2_ = (ushort)((short)uVar94 < sVar102) * sVar102 | ((short)uVar94 >= sVar102) * uVar94
  ;
  auVar157._10_2_ =
       (ushort)((short)uVar95 < sVar103) * sVar103 | ((short)uVar95 >= sVar103) * uVar95;
  auVar157._12_2_ =
       (ushort)((short)uVar96 < sVar104) * sVar104 | ((short)uVar96 >= sVar104) * uVar96;
  auVar157._14_2_ =
       (ushort)((short)uVar97 < sVar105) * sVar105 | ((short)uVar97 >= sVar105) * uVar97;
  auVar82 = psraw(auVar157,3);
  auVar89 = psubsw(auVar85,auVar82);
  auVar158._0_2_ = auVar82._0_2_ + 1;
  auVar158._2_2_ = auVar82._2_2_ + 1;
  auVar158._4_2_ = auVar82._4_2_ + 1;
  auVar158._6_2_ = auVar82._6_2_ + 1;
  auVar158._8_2_ = auVar82._8_2_ + 1;
  auVar158._10_2_ = auVar82._10_2_ + 1;
  auVar158._12_2_ = auVar82._12_2_ + 1;
  auVar158._14_2_ = auVar82._14_2_ + 1;
  auVar82 = psraw(auVar158,1);
  auVar85 = psubsw(auVar142,~auVar162 & auVar82);
  auVar82 = paddsw(~auVar162 & auVar82,auVar220);
  sVar107 = auVar89._0_2_;
  uVar88 = (ushort)(sVar204 < sVar107) * sVar204 | (ushort)(sVar204 >= sVar107) * sVar107;
  sVar107 = auVar89._2_2_;
  uVar91 = (ushort)(sVar207 < sVar107) * sVar207 | (ushort)(sVar207 >= sVar107) * sVar107;
  sVar107 = auVar89._4_2_;
  uVar92 = (ushort)(sVar209 < sVar107) * sVar209 | (ushort)(sVar209 >= sVar107) * sVar107;
  sVar107 = auVar89._6_2_;
  uVar93 = (ushort)(sVar211 < sVar107) * sVar211 | (ushort)(sVar211 >= sVar107) * sVar107;
  sVar107 = auVar89._8_2_;
  uVar94 = (ushort)(sVar213 < sVar107) * sVar213 | (ushort)(sVar213 >= sVar107) * sVar107;
  sVar107 = auVar89._10_2_;
  uVar95 = (ushort)(sVar215 < sVar107) * sVar215 | (ushort)(sVar215 >= sVar107) * sVar107;
  sVar107 = auVar89._12_2_;
  sVar108 = auVar89._14_2_;
  uVar96 = (ushort)(sVar217 < sVar107) * sVar217 | (ushort)(sVar217 >= sVar107) * sVar107;
  uVar97 = (ushort)(sVar219 < sVar108) * sVar219 | (ushort)(sVar219 >= sVar108) * sVar108;
  sVar107 = auVar90._0_2_;
  uVar179 = (ushort)(sVar204 < sVar107) * sVar204 | (ushort)(sVar204 >= sVar107) * sVar107;
  sVar107 = auVar90._2_2_;
  uVar187 = (ushort)(sVar207 < sVar107) * sVar207 | (ushort)(sVar207 >= sVar107) * sVar107;
  sVar107 = auVar90._4_2_;
  uVar189 = (ushort)(sVar209 < sVar107) * sVar209 | (ushort)(sVar209 >= sVar107) * sVar107;
  sVar107 = auVar90._6_2_;
  uVar191 = (ushort)(sVar211 < sVar107) * sVar211 | (ushort)(sVar211 >= sVar107) * sVar107;
  sVar107 = auVar90._8_2_;
  uVar193 = (ushort)(sVar213 < sVar107) * sVar213 | (ushort)(sVar213 >= sVar107) * sVar107;
  sVar107 = auVar90._10_2_;
  uVar195 = (ushort)(sVar215 < sVar107) * sVar215 | (ushort)(sVar215 >= sVar107) * sVar107;
  sVar107 = auVar90._12_2_;
  sVar108 = auVar90._14_2_;
  uVar197 = (ushort)(sVar217 < sVar107) * sVar217 | (ushort)(sVar217 >= sVar107) * sVar107;
  uVar199 = (ushort)(sVar219 < sVar108) * sVar219 | (ushort)(sVar219 >= sVar108) * sVar108;
  sVar107 = auVar85._0_2_;
  uVar140 = (ushort)(sVar204 < sVar107) * sVar204 | (ushort)(sVar204 >= sVar107) * sVar107;
  sVar107 = auVar85._2_2_;
  uVar143 = (ushort)(sVar207 < sVar107) * sVar207 | (ushort)(sVar207 >= sVar107) * sVar107;
  sVar107 = auVar85._4_2_;
  uVar145 = (ushort)(sVar209 < sVar107) * sVar209 | (ushort)(sVar209 >= sVar107) * sVar107;
  sVar107 = auVar85._6_2_;
  uVar147 = (ushort)(sVar211 < sVar107) * sVar211 | (ushort)(sVar211 >= sVar107) * sVar107;
  sVar107 = auVar85._8_2_;
  uVar149 = (ushort)(sVar213 < sVar107) * sVar213 | (ushort)(sVar213 >= sVar107) * sVar107;
  sVar107 = auVar85._10_2_;
  uVar151 = (ushort)(sVar215 < sVar107) * sVar215 | (ushort)(sVar215 >= sVar107) * sVar107;
  sVar107 = auVar85._12_2_;
  sVar108 = auVar85._14_2_;
  uVar153 = (ushort)(sVar217 < sVar107) * sVar217 | (ushort)(sVar217 >= sVar107) * sVar107;
  uVar155 = (ushort)(sVar219 < sVar108) * sVar219 | (ushort)(sVar219 >= sVar108) * sVar108;
  sVar107 = auVar82._0_2_;
  uVar159 = (ushort)(sVar204 < sVar107) * sVar204 | (ushort)(sVar204 >= sVar107) * sVar107;
  sVar204 = auVar82._2_2_;
  uVar164 = (ushort)(sVar207 < sVar204) * sVar207 | (ushort)(sVar207 >= sVar204) * sVar204;
  sVar204 = auVar82._4_2_;
  uVar166 = (ushort)(sVar209 < sVar204) * sVar209 | (ushort)(sVar209 >= sVar204) * sVar204;
  sVar204 = auVar82._6_2_;
  uVar168 = (ushort)(sVar211 < sVar204) * sVar211 | (ushort)(sVar211 >= sVar204) * sVar204;
  sVar204 = auVar82._8_2_;
  uVar170 = (ushort)(sVar213 < sVar204) * sVar213 | (ushort)(sVar213 >= sVar204) * sVar204;
  sVar204 = auVar82._10_2_;
  uVar172 = (ushort)(sVar215 < sVar204) * sVar215 | (ushort)(sVar215 >= sVar204) * sVar204;
  sVar204 = auVar82._12_2_;
  sVar207 = auVar82._14_2_;
  uVar174 = (ushort)(sVar217 < sVar204) * sVar217 | (ushort)(sVar217 >= sVar204) * sVar204;
  uVar176 = (ushort)(sVar219 < sVar207) * sVar219 | (ushort)(sVar219 >= sVar207) * sVar207;
  auVar205._0_2_ = (ushort)((short)uVar88 < sVar98) * sVar98 | ((short)uVar88 >= sVar98) * uVar88;
  auVar205._2_2_ = (ushort)((short)uVar91 < sVar99) * sVar99 | ((short)uVar91 >= sVar99) * uVar91;
  auVar205._4_2_ = (ushort)((short)uVar92 < sVar100) * sVar100 | ((short)uVar92 >= sVar100) * uVar92
  ;
  auVar205._6_2_ = (ushort)((short)uVar93 < sVar101) * sVar101 | ((short)uVar93 >= sVar101) * uVar93
  ;
  auVar205._8_2_ = (ushort)((short)uVar94 < sVar102) * sVar102 | ((short)uVar94 >= sVar102) * uVar94
  ;
  auVar205._10_2_ =
       (ushort)((short)uVar95 < sVar103) * sVar103 | ((short)uVar95 >= sVar103) * uVar95;
  auVar205._12_2_ =
       (ushort)((short)uVar96 < sVar104) * sVar104 | ((short)uVar96 >= sVar104) * uVar96;
  auVar205._14_2_ =
       (ushort)((short)uVar97 < sVar105) * sVar105 | ((short)uVar97 >= sVar105) * uVar97;
  auVar186._0_2_ = (ushort)((short)uVar179 < sVar98) * sVar98 | ((short)uVar179 >= sVar98) * uVar179
  ;
  auVar186._2_2_ = (ushort)((short)uVar187 < sVar99) * sVar99 | ((short)uVar187 >= sVar99) * uVar187
  ;
  auVar186._4_2_ =
       (ushort)((short)uVar189 < sVar100) * sVar100 | ((short)uVar189 >= sVar100) * uVar189;
  auVar186._6_2_ =
       (ushort)((short)uVar191 < sVar101) * sVar101 | ((short)uVar191 >= sVar101) * uVar191;
  auVar186._8_2_ =
       (ushort)((short)uVar193 < sVar102) * sVar102 | ((short)uVar193 >= sVar102) * uVar193;
  auVar186._10_2_ =
       (ushort)((short)uVar195 < sVar103) * sVar103 | ((short)uVar195 >= sVar103) * uVar195;
  auVar186._12_2_ =
       (ushort)((short)uVar197 < sVar104) * sVar104 | ((short)uVar197 >= sVar104) * uVar197;
  auVar186._14_2_ =
       (ushort)((short)uVar199 < sVar105) * sVar105 | ((short)uVar199 >= sVar105) * uVar199;
  auVar220._0_2_ = (ushort)((short)uVar140 < sVar98) * sVar98 | ((short)uVar140 >= sVar98) * uVar140
  ;
  auVar220._2_2_ = (ushort)((short)uVar143 < sVar99) * sVar99 | ((short)uVar143 >= sVar99) * uVar143
  ;
  auVar220._4_2_ =
       (ushort)((short)uVar145 < sVar100) * sVar100 | ((short)uVar145 >= sVar100) * uVar145;
  auVar220._6_2_ =
       (ushort)((short)uVar147 < sVar101) * sVar101 | ((short)uVar147 >= sVar101) * uVar147;
  auVar220._8_2_ =
       (ushort)((short)uVar149 < sVar102) * sVar102 | ((short)uVar149 >= sVar102) * uVar149;
  auVar220._10_2_ =
       (ushort)((short)uVar151 < sVar103) * sVar103 | ((short)uVar151 >= sVar103) * uVar151;
  auVar220._12_2_ =
       (ushort)((short)uVar153 < sVar104) * sVar104 | ((short)uVar153 >= sVar104) * uVar153;
  auVar220._14_2_ =
       (ushort)((short)uVar155 < sVar105) * sVar105 | ((short)uVar155 >= sVar105) * uVar155;
  auVar163._0_2_ = (ushort)((short)uVar159 < sVar98) * sVar98 | ((short)uVar159 >= sVar98) * uVar159
  ;
  auVar163._2_2_ = (ushort)((short)uVar164 < sVar99) * sVar99 | ((short)uVar164 >= sVar99) * uVar164
  ;
  auVar163._4_2_ =
       (ushort)((short)uVar166 < sVar100) * sVar100 | ((short)uVar166 >= sVar100) * uVar166;
  auVar163._6_2_ =
       (ushort)((short)uVar168 < sVar101) * sVar101 | ((short)uVar168 >= sVar101) * uVar168;
  auVar163._8_2_ =
       (ushort)((short)uVar170 < sVar102) * sVar102 | ((short)uVar170 >= sVar102) * uVar170;
  auVar163._10_2_ =
       (ushort)((short)uVar172 < sVar103) * sVar103 | ((short)uVar172 >= sVar103) * uVar172;
  auVar163._12_2_ =
       (ushort)((short)uVar174 < sVar104) * sVar104 | ((short)uVar174 >= sVar104) * uVar174;
  auVar163._14_2_ =
       (ushort)((short)uVar176 < sVar105) * sVar105 | ((short)uVar176 >= sVar105) * uVar176;
  local_2a8 = paddsw(auVar205,auVar178);
  local_288 = paddsw(auVar186,auVar178);
  local_2b8 = paddsw(auVar220,auVar178);
  local_298 = paddsw(auVar163,auVar178);
  if ((((((((((((((((auVar181 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar181 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar181 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar181 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar181 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar181 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar181 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar181 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar181 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar181 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar181 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar181 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar181 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar181 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar181 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar181[0xf]) {
    local_208 = local_288;
    local_278 = local_2a8;
    local_1f8 = local_298;
    local_268 = local_2b8;
  }
  else {
    auVar89 = psubusw(auVar83,auVar111);
    auVar84._0_2_ = -(ushort)(auVar89._0_2_ == 0);
    auVar84._2_2_ = -(ushort)(auVar89._2_2_ == 0);
    auVar84._4_2_ = -(ushort)(auVar89._4_2_ == 0);
    auVar84._6_2_ = -(ushort)(auVar89._6_2_ == 0);
    auVar84._8_2_ = -(ushort)(auVar89._8_2_ == 0);
    auVar84._10_2_ = -(ushort)(auVar89._10_2_ == 0);
    auVar84._12_2_ = -(ushort)(auVar89._12_2_ == 0);
    auVar84._14_2_ = -(ushort)(auVar89._14_2_ == 0);
    auVar84 = auVar84 & auVar181;
    local_348 = local_1f8._0_2_;
    sStack_346 = local_1f8._2_2_;
    sStack_344 = local_1f8._4_2_;
    sStack_342 = local_1f8._6_2_;
    sStack_340 = local_1f8._8_2_;
    sStack_33e = local_1f8._10_2_;
    sStack_33c = local_1f8._12_2_;
    sStack_33a = local_1f8._14_2_;
    sVar98 = local_208._0_2_;
    sVar99 = local_208._2_2_;
    sVar100 = local_208._4_2_;
    sVar101 = local_208._6_2_;
    sVar102 = local_208._8_2_;
    sVar103 = local_208._10_2_;
    sVar104 = local_208._12_2_;
    sVar105 = local_208._14_2_;
    sVar180 = local_348 + sVar98 + local_1e8._0_2_;
    sVar188 = sStack_346 + sVar99 + local_1e8._2_2_;
    sVar190 = sStack_344 + sVar100 + local_1e8._4_2_;
    sVar192 = sStack_342 + sVar101 + local_1e8._6_2_;
    sVar194 = sStack_340 + sVar102 + local_1e8._8_2_;
    sVar196 = sStack_33e + sVar103 + local_1e8._10_2_;
    sVar198 = sStack_33c + sVar104 + local_1e8._12_2_;
    sVar200 = sStack_33a + sVar105 + local_1e8._14_2_;
    local_358 = local_268._0_2_;
    sStack_356 = local_268._2_2_;
    sStack_354 = local_268._4_2_;
    sStack_352 = local_268._6_2_;
    sStack_350 = local_268._8_2_;
    sStack_34e = local_268._10_2_;
    sStack_34c = local_268._12_2_;
    sStack_34a = local_268._14_2_;
    sVar204 = local_278._0_2_;
    sVar207 = local_278._2_2_;
    sVar209 = local_278._4_2_;
    sVar211 = local_278._6_2_;
    sVar213 = local_278._8_2_;
    sVar215 = local_278._10_2_;
    sVar217 = local_278._12_2_;
    sVar219 = local_278._14_2_;
    sVar107 = local_358 + sVar204 + local_258._0_2_;
    sVar112 = sStack_356 + sVar207 + local_258._2_2_;
    sVar116 = sStack_354 + sVar209 + local_258._4_2_;
    sVar120 = sStack_352 + sVar211 + local_258._6_2_;
    sVar124 = sStack_350 + sVar213 + local_258._8_2_;
    sVar128 = sStack_34e + sVar215 + local_258._10_2_;
    sVar132 = sStack_34c + sVar217 + local_258._12_2_;
    sVar136 = sStack_34a + sVar219 + local_258._14_2_;
    sVar141 = sVar107 + sVar180;
    sVar144 = sVar112 + sVar188;
    sVar146 = sVar116 + sVar190;
    sVar148 = sVar120 + sVar192;
    sVar150 = sVar124 + sVar194;
    sVar152 = sVar128 + sVar196;
    sVar154 = sVar132 + sVar198;
    sVar156 = sVar136 + sVar200;
    sVar108 = sVar141 + 4;
    sVar113 = sVar144 + 4;
    sVar117 = sVar146 + 4;
    sVar121 = sVar148 + 4;
    sVar125 = sVar150 + 4;
    sVar129 = sVar152 + 4;
    sVar133 = sVar154 + 4;
    sVar137 = sVar156 + 4;
    local_2c8 = (ushort)(local_1d8 + sVar98 + sVar108) >> 3;
    uStack_2c6 = (ushort)(sStack_1d6 + sVar99 + sVar113) >> 3;
    uStack_2c4 = (ushort)(sStack_1d4 + sVar100 + sVar117) >> 3;
    uStack_2c2 = (ushort)(sStack_1d2 + sVar101 + sVar121) >> 3;
    uStack_2c0 = (ushort)(sStack_1d0 + sVar102 + sVar125) >> 3;
    uStack_2be = (ushort)(sStack_1ce + sVar103 + sVar129) >> 3;
    uStack_2bc = (ushort)(sStack_1cc + sVar104 + sVar133) >> 3;
    uStack_2ba = (ushort)(sStack_1ca + sVar105 + sVar137) >> 3;
    local_2e8 = (ushort)(local_248 + sVar204 + sVar108) >> 3;
    uStack_2e6 = (ushort)(sStack_246 + sVar207 + sVar113) >> 3;
    uStack_2e4 = (ushort)(sStack_244 + sVar209 + sVar117) >> 3;
    uStack_2e2 = (ushort)(sStack_242 + sVar211 + sVar121) >> 3;
    uStack_2e0 = (ushort)(sStack_240 + sVar213 + sVar125) >> 3;
    uStack_2de = (ushort)(sStack_23e + sVar215 + sVar129) >> 3;
    uStack_2dc = (ushort)(sStack_23c + sVar217 + sVar133) >> 3;
    uStack_2da = (ushort)(sStack_23a + sVar219 + sVar137) >> 3;
    local_2d8 = (ushort)(local_1d8 * 2 + local_348 + (sVar108 - local_258._0_2_)) >> 3;
    uStack_2d6 = (ushort)(sStack_1d6 * 2 + sStack_346 + (sVar113 - local_258._2_2_)) >> 3;
    uStack_2d4 = (ushort)(sStack_1d4 * 2 + sStack_344 + (sVar117 - local_258._4_2_)) >> 3;
    uStack_2d2 = (ushort)(sStack_1d2 * 2 + sStack_342 + (sVar121 - local_258._6_2_)) >> 3;
    uStack_2d0 = (ushort)(sStack_1d0 * 2 + sStack_340 + (sVar125 - local_258._8_2_)) >> 3;
    uStack_2ce = (ushort)(sStack_1ce * 2 + sStack_33e + (sVar129 - local_258._10_2_)) >> 3;
    uStack_2cc = (ushort)(sStack_1cc * 2 + sStack_33c + (sVar133 - local_258._12_2_)) >> 3;
    uStack_2ca = (ushort)(sStack_1ca * 2 + sStack_33a + (sVar137 - local_258._14_2_)) >> 3;
    local_2f8 = (ushort)(local_248 * 2 + local_358 + (sVar108 - local_1e8._0_2_)) >> 3;
    uStack_2f6 = (ushort)(sStack_246 * 2 + sStack_356 + (sVar113 - local_1e8._2_2_)) >> 3;
    uStack_2f4 = (ushort)(sStack_244 * 2 + sStack_354 + (sVar117 - local_1e8._4_2_)) >> 3;
    uStack_2f2 = (ushort)(sStack_242 * 2 + sStack_352 + (sVar121 - local_1e8._6_2_)) >> 3;
    uStack_2f0 = (ushort)(sStack_240 * 2 + sStack_350 + (sVar125 - local_1e8._8_2_)) >> 3;
    uStack_2ee = (ushort)(sStack_23e * 2 + sStack_34e + (sVar129 - local_1e8._10_2_)) >> 3;
    uStack_2ec = (ushort)(sStack_23c * 2 + sStack_34c + (sVar133 - local_1e8._12_2_)) >> 3;
    uStack_2ea = (ushort)(sStack_23a * 2 + sStack_34a + (sVar137 - local_1e8._14_2_)) >> 3;
    if ((((((((((((((((auVar84 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar84 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar84 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar84 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar84 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar84 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar84 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar84 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar84 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar84 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar84 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar84 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar84[0xf] < '\0')
    {
      local_318 = local_1c8._0_2_;
      sStack_316 = local_1c8._2_2_;
      sStack_314 = local_1c8._4_2_;
      sStack_312 = local_1c8._6_2_;
      sStack_310 = local_1c8._8_2_;
      sStack_30e = local_1c8._10_2_;
      sStack_30c = local_1c8._12_2_;
      sStack_30a = local_1c8._14_2_;
      local_158 = (short)local_1b8;
      sStack_156 = (short)((ulong)local_1b8 >> 0x10);
      sStack_154 = (short)((ulong)local_1b8 >> 0x20);
      sStack_152 = (short)((ulong)local_1b8 >> 0x30);
      sStack_150 = (short)uStack_1b0;
      sStack_14e = (short)((ulong)uStack_1b0 >> 0x10);
      sStack_14c = (short)((ulong)uStack_1b0 >> 0x20);
      sStack_14a = (short)((ulong)uStack_1b0 >> 0x30);
      sVar109 = local_318 + local_158 + local_1d8;
      sVar114 = sStack_316 + sStack_156 + sStack_1d6;
      sVar118 = sStack_314 + sStack_154 + sStack_1d4;
      sVar122 = sStack_312 + sStack_152 + sStack_1d2;
      sVar126 = sStack_310 + sStack_150 + sStack_1d0;
      sVar130 = sStack_30e + sStack_14e + sStack_1ce;
      sVar134 = sStack_30c + sStack_14c + sStack_1cc;
      sVar138 = sStack_30a + sStack_14a + sStack_1ca;
      local_308 = local_238._0_2_;
      sStack_306 = local_238._2_2_;
      sStack_304 = local_238._4_2_;
      sStack_302 = local_238._6_2_;
      sStack_300 = local_238._8_2_;
      sStack_2fe = local_238._10_2_;
      sStack_2fc = local_238._12_2_;
      sStack_2fa = local_238._14_2_;
      sVar203 = local_228 + local_308 + local_248;
      sVar206 = sStack_226 + sStack_306 + sStack_246;
      sVar208 = sStack_224 + sStack_304 + sStack_244;
      sVar210 = sStack_222 + sStack_302 + sStack_242;
      sVar212 = sStack_220 + sStack_300 + sStack_240;
      sVar214 = sStack_21e + sStack_2fe + sStack_23e;
      sVar216 = sStack_21c + sStack_2fc + sStack_23c;
      sVar218 = sStack_21a + sStack_2fa + sStack_23a;
      sVar110 = sVar109 + sVar203 + sVar141 + 8;
      sVar115 = sVar114 + sVar206 + sVar144 + 8;
      sVar119 = sVar118 + sVar208 + sVar146 + 8;
      sVar123 = sVar122 + sVar210 + sVar148 + 8;
      sVar127 = sVar126 + sVar212 + sVar150 + 8;
      sVar131 = sVar130 + sVar214 + sVar152 + 8;
      sVar135 = sVar134 + sVar216 + sVar154 + 8;
      sVar139 = sVar138 + sVar218 + sVar156 + 8;
      auVar50._8_8_ = uStack_1a0;
      auVar50._0_8_ = local_1a8;
      sVar160 = (short)local_1a8;
      sVar165 = (short)((ulong)local_1a8 >> 0x10);
      sVar167 = (short)((ulong)local_1a8 >> 0x20);
      sVar169 = (short)((ulong)local_1a8 >> 0x30);
      sVar171 = (short)uStack_1a0;
      sVar173 = (short)((ulong)uStack_1a0 >> 0x10);
      sVar175 = (short)((ulong)uStack_1a0 >> 0x20);
      sVar177 = (short)((ulong)uStack_1a0 >> 0x30);
      auVar49._8_8_ = uStack_210;
      auVar49._0_8_ = local_218;
      sVar141 = (short)local_218;
      sVar144 = (short)((ulong)local_218 >> 0x10);
      sVar146 = (short)((ulong)local_218 >> 0x20);
      sVar148 = (short)((ulong)local_218 >> 0x30);
      sVar150 = (short)uStack_210;
      sVar152 = (short)((ulong)uStack_210 >> 0x10);
      sVar154 = (short)((ulong)uStack_210 >> 0x20);
      sVar156 = (short)((ulong)uStack_210 >> 0x30);
      local_98 = (ushort)(local_348 + sVar98 + sVar204 + sVar160 + sVar110) >> 4;
      uStack_96 = (ushort)(sStack_346 + sVar99 + sVar207 + sVar165 + sVar115) >> 4;
      uStack_94 = (ushort)(sStack_344 + sVar100 + sVar209 + sVar167 + sVar119) >> 4;
      uStack_92 = (ushort)(sStack_342 + sVar101 + sVar211 + sVar169 + sVar123) >> 4;
      uStack_90 = (ushort)(sStack_340 + sVar102 + sVar213 + sVar171 + sVar127) >> 4;
      uStack_8e = (ushort)(sStack_33e + sVar103 + sVar215 + sVar173 + sVar131) >> 4;
      uStack_8c = (ushort)(sStack_33c + sVar104 + sVar217 + sVar175 + sVar135) >> 4;
      uStack_8a = (ushort)(sStack_33a + sVar105 + sVar219 + sVar177 + sVar139) >> 4;
      local_f8 = (ushort)(local_358 + sVar204 + sVar98 + sVar141 + sVar110) >> 4;
      uStack_f6 = (ushort)(sStack_356 + sVar207 + sVar99 + sVar144 + sVar115) >> 4;
      uStack_f4 = (ushort)(sStack_354 + sVar209 + sVar100 + sVar146 + sVar119) >> 4;
      uStack_f2 = (ushort)(sStack_352 + sVar211 + sVar101 + sVar148 + sVar123) >> 4;
      uStack_f0 = (ushort)(sStack_350 + sVar213 + sVar102 + sVar150 + sVar127) >> 4;
      uStack_ee = (ushort)(sStack_34e + sVar215 + sVar103 + sVar152 + sVar131) >> 4;
      uStack_ec = (ushort)(sStack_34c + sVar217 + sVar104 + sVar154 + sVar135) >> 4;
      uStack_ea = (ushort)(sStack_34a + sVar219 + sVar105 + sVar156 + sVar139) >> 4;
      local_88 = (ushort)(sVar180 + sVar160 * 2 + (sVar110 - local_228)) >> 4;
      uStack_86 = (ushort)(sVar188 + sVar165 * 2 + (sVar115 - sStack_226)) >> 4;
      uStack_84 = (ushort)(sVar190 + sVar167 * 2 + (sVar119 - sStack_224)) >> 4;
      uStack_82 = (ushort)(sVar192 + sVar169 * 2 + (sVar123 - sStack_222)) >> 4;
      uStack_80 = (ushort)(sVar194 + sVar171 * 2 + (sVar127 - sStack_220)) >> 4;
      uStack_7e = (ushort)(sVar196 + sVar173 * 2 + (sVar131 - sStack_21e)) >> 4;
      uStack_7c = (ushort)(sVar198 + sVar175 * 2 + (sVar135 - sStack_21c)) >> 4;
      uStack_7a = (ushort)(sVar200 + sVar177 * 2 + (sVar139 - sStack_21a)) >> 4;
      local_e8 = (ushort)(sVar107 + sVar141 * 2 + (sVar110 - local_158)) >> 4;
      uStack_e6 = (ushort)(sVar112 + sVar144 * 2 + (sVar115 - sStack_156)) >> 4;
      uStack_e4 = (ushort)(sVar116 + sVar146 * 2 + (sVar119 - sStack_154)) >> 4;
      uStack_e2 = (ushort)(sVar120 + sVar148 * 2 + (sVar123 - sStack_152)) >> 4;
      uStack_e0 = (ushort)(sVar124 + sVar150 * 2 + (sVar127 - sStack_150)) >> 4;
      uStack_de = (ushort)(sVar128 + sVar152 * 2 + (sVar131 - sStack_14e)) >> 4;
      uStack_dc = (ushort)(sVar132 + sVar154 * 2 + (sVar135 - sStack_14c)) >> 4;
      uStack_da = (ushort)(sVar136 + sVar156 * 2 + (sVar139 - sStack_14a)) >> 4;
      sVar204 = (sVar110 - local_228) - local_308;
      sVar207 = (sVar115 - sStack_226) - sStack_306;
      sVar209 = (sVar119 - sStack_224) - sStack_304;
      sVar211 = (sVar123 - sStack_222) - sStack_302;
      sVar213 = (sVar127 - sStack_220) - sStack_300;
      sVar215 = (sVar131 - sStack_21e) - sStack_2fe;
      sVar217 = (sVar135 - sStack_21c) - sStack_2fc;
      sVar219 = (sVar139 - sStack_21a) - sStack_2fa;
      local_78 = (ushort)(local_1e8._0_2_ + local_348 + local_1d8 + sVar160 * 3 + sVar204) >> 4;
      uStack_76 = (ushort)(local_1e8._2_2_ + sStack_346 + sStack_1d6 + sVar165 * 3 + sVar207) >> 4;
      uStack_74 = (ushort)(local_1e8._4_2_ + sStack_344 + sStack_1d4 + sVar167 * 3 + sVar209) >> 4;
      uStack_72 = (ushort)(local_1e8._6_2_ + sStack_342 + sStack_1d2 + sVar169 * 3 + sVar211) >> 4;
      uStack_70 = (ushort)(local_1e8._8_2_ + sStack_340 + sStack_1d0 + sVar171 * 3 + sVar213) >> 4;
      uStack_6e = (ushort)(local_1e8._10_2_ + sStack_33e + sStack_1ce + sVar173 * 3 + sVar215) >> 4;
      uStack_6c = (ushort)(local_1e8._12_2_ + sStack_33c + sStack_1cc + sVar175 * 3 + sVar217) >> 4;
      uStack_6a = (ushort)(local_1e8._14_2_ + sStack_33a + sStack_1ca + sVar177 * 3 + sVar219) >> 4;
      sVar98 = (sVar110 - local_158) - local_318;
      sVar99 = (sVar115 - sStack_156) - sStack_316;
      sVar100 = (sVar119 - sStack_154) - sStack_314;
      sVar101 = (sVar123 - sStack_152) - sStack_312;
      sVar102 = (sVar127 - sStack_150) - sStack_310;
      sVar103 = (sVar131 - sStack_14e) - sStack_30e;
      sVar104 = (sVar135 - sStack_14c) - sStack_30c;
      sVar105 = (sVar139 - sStack_14a) - sStack_30a;
      local_d8 = (ushort)(local_258._0_2_ + local_358 + local_248 + sVar141 * 3 + sVar98) >> 4;
      uStack_d6 = (ushort)(local_258._2_2_ + sStack_356 + sStack_246 + sVar144 * 3 + sVar99) >> 4;
      uStack_d4 = (ushort)(local_258._4_2_ + sStack_354 + sStack_244 + sVar146 * 3 + sVar100) >> 4;
      uStack_d2 = (ushort)(local_258._6_2_ + sStack_352 + sStack_242 + sVar148 * 3 + sVar101) >> 4;
      uStack_d0 = (ushort)(local_258._8_2_ + sStack_350 + sStack_240 + sVar150 * 3 + sVar102) >> 4;
      uStack_ce = (ushort)(local_258._10_2_ + sStack_34e + sStack_23e + sVar152 * 3 + sVar103) >> 4;
      uStack_cc = (ushort)(local_258._12_2_ + sStack_34c + sStack_23c + sVar154 * 3 + sVar104) >> 4;
      uStack_ca = (ushort)(local_258._14_2_ + sStack_34a + sStack_23a + sVar156 * 3 + sVar105) >> 4;
      sVar98 = sVar98 - local_1d8;
      sVar99 = sVar99 - sStack_1d6;
      sVar100 = sVar100 - sStack_1d4;
      sVar101 = sVar101 - sStack_1d2;
      sVar102 = sVar102 - sStack_1d0;
      sVar103 = sVar103 - sStack_1ce;
      sVar104 = sVar104 - sStack_1cc;
      sVar105 = sVar105 - sStack_1ca;
      auVar89 = psllw(auVar50,2);
      sVar204 = sVar204 - local_248;
      sVar207 = sVar207 - sStack_246;
      sVar209 = sVar209 - sStack_244;
      sVar211 = sVar211 - sStack_242;
      sVar213 = sVar213 - sStack_240;
      sVar215 = sVar215 - sStack_23e;
      sVar217 = sVar217 - sStack_23c;
      sVar219 = sVar219 - sStack_23a;
      local_68 = (ushort)(local_1d8 + local_318 + local_1e8._0_2_ + auVar89._0_2_ + sVar204) >> 4;
      uStack_66 = (ushort)(sStack_1d6 + sStack_316 + local_1e8._2_2_ + auVar89._2_2_ + sVar207) >> 4
      ;
      uStack_64 = (ushort)(sStack_1d4 + sStack_314 + local_1e8._4_2_ + auVar89._4_2_ + sVar209) >> 4
      ;
      uStack_62 = (ushort)(sStack_1d2 + sStack_312 + local_1e8._6_2_ + auVar89._6_2_ + sVar211) >> 4
      ;
      uStack_60 = (ushort)(sStack_1d0 + sStack_310 + local_1e8._8_2_ + auVar89._8_2_ + sVar213) >> 4
      ;
      uStack_5e = (ushort)(sStack_1ce + sStack_30e + local_1e8._10_2_ + auVar89._10_2_ + sVar215) >>
                  4;
      uStack_5c = (ushort)(sStack_1cc + sStack_30c + local_1e8._12_2_ + auVar89._12_2_ + sVar217) >>
                  4;
      uStack_5a = (ushort)(sStack_1ca + sStack_30a + local_1e8._14_2_ + auVar89._14_2_ + sVar219) >>
                  4;
      auVar85 = psllw(auVar49,2);
      local_c8 = (ushort)(local_248 + local_308 + local_258._0_2_ + auVar85._0_2_ + sVar98) >> 4;
      uStack_c6 = (ushort)(sStack_246 + sStack_306 + local_258._2_2_ + auVar85._2_2_ + sVar99) >> 4;
      uStack_c4 = (ushort)(sStack_244 + sStack_304 + local_258._4_2_ + auVar85._4_2_ + sVar100) >> 4
      ;
      uStack_c2 = (ushort)(sStack_242 + sStack_302 + local_258._6_2_ + auVar85._6_2_ + sVar101) >> 4
      ;
      uStack_c0 = (ushort)(sStack_240 + sStack_300 + local_258._8_2_ + auVar85._8_2_ + sVar102) >> 4
      ;
      uStack_be = (ushort)(sStack_23e + sStack_2fe + local_258._10_2_ + auVar85._10_2_ + sVar103) >>
                  4;
      uStack_bc = (ushort)(sStack_23c + sStack_2fc + local_258._12_2_ + auVar85._12_2_ + sVar104) >>
                  4;
      uStack_ba = (ushort)(sStack_23a + sStack_2fa + local_258._14_2_ + auVar85._14_2_ + sVar105) >>
                  4;
      sVar204 = sVar204 - local_258._0_2_;
      sVar207 = sVar207 - local_258._2_2_;
      sVar209 = sVar209 - local_258._4_2_;
      sVar211 = sVar211 - local_258._6_2_;
      sVar213 = sVar213 - local_258._8_2_;
      sVar215 = sVar215 - local_258._10_2_;
      sVar217 = sVar217 - local_258._12_2_;
      sVar219 = sVar219 - local_258._14_2_;
      sVar98 = sVar98 - local_1e8._0_2_;
      sVar99 = sVar99 - local_1e8._2_2_;
      sVar100 = sVar100 - local_1e8._4_2_;
      sVar101 = sVar101 - local_1e8._6_2_;
      sVar102 = sVar102 - local_1e8._8_2_;
      sVar103 = sVar103 - local_1e8._10_2_;
      sVar104 = sVar104 - local_1e8._12_2_;
      sVar105 = sVar105 - local_1e8._14_2_;
      local_58 = (ushort)(auVar89._0_2_ + sVar160 + sVar109 + sVar204) >> 4;
      uStack_56 = (ushort)(auVar89._2_2_ + sVar165 + sVar114 + sVar207) >> 4;
      uStack_54 = (ushort)(auVar89._4_2_ + sVar167 + sVar118 + sVar209) >> 4;
      uStack_52 = (ushort)(auVar89._6_2_ + sVar169 + sVar122 + sVar211) >> 4;
      uStack_50 = (ushort)(auVar89._8_2_ + sVar171 + sVar126 + sVar213) >> 4;
      uStack_4e = (ushort)(auVar89._10_2_ + sVar173 + sVar130 + sVar215) >> 4;
      uStack_4c = (ushort)(auVar89._12_2_ + sVar175 + sVar134 + sVar217) >> 4;
      uStack_4a = (ushort)(auVar89._14_2_ + sVar177 + sVar138 + sVar219) >> 4;
      local_b8 = (ushort)(auVar85._0_2_ + sVar141 + sVar203 + sVar98) >> 4;
      uStack_b6 = (ushort)(auVar85._2_2_ + sVar144 + sVar206 + sVar99) >> 4;
      uStack_b4 = (ushort)(auVar85._4_2_ + sVar146 + sVar208 + sVar100) >> 4;
      uStack_b2 = (ushort)(auVar85._6_2_ + sVar148 + sVar210 + sVar101) >> 4;
      uStack_b0 = (ushort)(auVar85._8_2_ + sVar150 + sVar212 + sVar102) >> 4;
      uStack_ae = (ushort)(auVar85._10_2_ + sVar152 + sVar214 + sVar103) >> 4;
      uStack_ac = (ushort)(auVar85._12_2_ + sVar154 + sVar216 + sVar104) >> 4;
      uStack_aa = (ushort)(auVar85._14_2_ + sVar156 + sVar218 + sVar105) >> 4;
      local_48 = (ushort)(((local_318 + local_158) - local_358) + sVar160 * 7 + sVar204) >> 4;
      uStack_46 = (ushort)(((sStack_316 + sStack_156) - sStack_356) + sVar165 * 7 + sVar207) >> 4;
      uStack_44 = (ushort)(((sStack_314 + sStack_154) - sStack_354) + sVar167 * 7 + sVar209) >> 4;
      uStack_42 = (ushort)(((sStack_312 + sStack_152) - sStack_352) + sVar169 * 7 + sVar211) >> 4;
      uStack_40 = (ushort)(((sStack_310 + sStack_150) - sStack_350) + sVar171 * 7 + sVar213) >> 4;
      uStack_3e = (ushort)(((sStack_30e + sStack_14e) - sStack_34e) + sVar173 * 7 + sVar215) >> 4;
      uStack_3c = (ushort)(((sStack_30c + sStack_14c) - sStack_34c) + sVar175 * 7 + sVar217) >> 4;
      uStack_3a = (ushort)(((sStack_30a + sStack_14a) - sStack_34a) + sVar177 * 7 + sVar219) >> 4;
      local_a8 = (ushort)(((local_228 + local_308) - local_348) + sVar141 * 7 + sVar98) >> 4;
      uStack_a6 = (ushort)(((sStack_226 + sStack_306) - sStack_346) + sVar144 * 7 + sVar99) >> 4;
      uStack_a4 = (ushort)(((sStack_224 + sStack_304) - sStack_344) + sVar146 * 7 + sVar100) >> 4;
      uStack_a2 = (ushort)(((sStack_222 + sStack_302) - sStack_342) + sVar148 * 7 + sVar101) >> 4;
      uStack_a0 = (ushort)(((sStack_220 + sStack_300) - sStack_340) + sVar150 * 7 + sVar102) >> 4;
      uStack_9e = (ushort)(((sStack_21e + sStack_2fe) - sStack_33e) + sVar152 * 7 + sVar103) >> 4;
      uStack_9c = (ushort)(((sStack_21c + sStack_2fc) - sStack_33c) + sVar154 * 7 + sVar104) >> 4;
      uStack_9a = (ushort)(((sStack_21a + sStack_2fa) - sStack_33a) + sVar156 * 7 + sVar105) >> 4;
    }
    auVar106._0_2_ =
         (ushort)((local_1d8 * 3 - local_358) + local_1e8._0_2_ + (sVar108 - local_258._0_2_)) >> 3;
    auVar106._2_2_ =
         (ushort)((sStack_1d6 * 3 - sStack_356) + local_1e8._2_2_ + (sVar113 - local_258._2_2_)) >>
         3;
    auVar106._4_2_ =
         (ushort)((sStack_1d4 * 3 - sStack_354) + local_1e8._4_2_ + (sVar117 - local_258._4_2_)) >>
         3;
    auVar106._6_2_ =
         (ushort)((sStack_1d2 * 3 - sStack_352) + local_1e8._6_2_ + (sVar121 - local_258._6_2_)) >>
         3;
    auVar106._8_2_ =
         (ushort)((sStack_1d0 * 3 - sStack_350) + local_1e8._8_2_ + (sVar125 - local_258._8_2_)) >>
         3;
    auVar106._10_2_ =
         (ushort)((sStack_1ce * 3 - sStack_34e) + local_1e8._10_2_ + (sVar129 - local_258._10_2_))
         >> 3;
    auVar106._12_2_ =
         (ushort)((sStack_1cc * 3 - sStack_34c) + local_1e8._12_2_ + (sVar133 - local_258._12_2_))
         >> 3;
    auVar106._14_2_ =
         (ushort)((sStack_1ca * 3 - sStack_34a) + local_1e8._14_2_ + (sVar137 - local_258._14_2_))
         >> 3;
    auVar202._0_2_ =
         (ushort)((local_248 * 3 - local_348) + local_258._0_2_ + (sVar108 - local_1e8._0_2_)) >> 3;
    auVar202._2_2_ =
         (ushort)((sStack_246 * 3 - sStack_346) + local_258._2_2_ + (sVar113 - local_1e8._2_2_)) >>
         3;
    auVar202._4_2_ =
         (ushort)((sStack_244 * 3 - sStack_344) + local_258._4_2_ + (sVar117 - local_1e8._4_2_)) >>
         3;
    auVar202._6_2_ =
         (ushort)((sStack_242 * 3 - sStack_342) + local_258._6_2_ + (sVar121 - local_1e8._6_2_)) >>
         3;
    auVar202._8_2_ =
         (ushort)((sStack_240 * 3 - sStack_340) + local_258._8_2_ + (sVar125 - local_1e8._8_2_)) >>
         3;
    auVar202._10_2_ =
         (ushort)((sStack_23e * 3 - sStack_33e) + local_258._10_2_ + (sVar129 - local_1e8._10_2_))
         >> 3;
    auVar202._12_2_ =
         (ushort)((sStack_23c * 3 - sStack_33c) + local_258._12_2_ + (sVar133 - local_1e8._12_2_))
         >> 3;
    auVar202._14_2_ =
         (ushort)((sStack_23a * 3 - sStack_33a) + local_258._14_2_ + (sVar137 - local_1e8._14_2_))
         >> 3;
    auVar87._8_4_ = 0xffffffff;
    auVar87._0_8_ = 0xffffffffffffffff;
    auVar87._12_4_ = 0xffffffff;
    auVar87 = auVar87 ^ auVar181;
    pauVar71 = &local_288;
    pauVar73 = (undefined1 (*) [16])&local_2c8;
    pauVar74 = &local_208;
    pauVar76 = (undefined1 (*) [16])&local_2e8;
    pauVar78 = &local_2a8;
    pauVar80 = &local_278;
    bVar69 = true;
    do {
      bVar75 = bVar69;
      auVar89 = *pauVar71;
      *pauVar71 = auVar89 & auVar87;
      auVar85 = *pauVar73;
      *pauVar73 = auVar85 & auVar181;
      *pauVar74 = auVar85 & auVar181 | auVar89 & auVar87;
      auVar89 = *pauVar78;
      *pauVar78 = auVar89 & auVar87;
      auVar85 = *pauVar76;
      *pauVar76 = auVar85 & auVar181;
      *pauVar80 = auVar85 & auVar181 | auVar89 & auVar87;
      pauVar71 = &local_298;
      pauVar73 = (undefined1 (*) [16])&local_2d8;
      pauVar74 = &local_1f8;
      pauVar76 = (undefined1 (*) [16])&local_2f8;
      pauVar78 = &local_2b8;
      pauVar80 = &local_268;
      bVar69 = false;
    } while (bVar75);
    local_1e8 = ~auVar181 & local_1e8 | auVar106 & auVar181;
    local_258 = ~auVar181 & local_258 | auVar202 & auVar181;
    pauVar71 = (undefined1 (*) [16])&local_2c8;
    pauVar73 = &local_278;
    pauVar74 = &local_2a8;
    pauVar76 = &local_208;
    pauVar78 = &local_288;
    pauVar80 = (undefined1 (*) [16])&local_2e8;
    bVar69 = true;
    do {
      bVar75 = bVar69;
      auVar89 = *pauVar78;
      *pauVar78 = auVar89 & auVar87;
      auVar85 = *pauVar71;
      *pauVar71 = auVar85 & auVar181;
      *pauVar76 = auVar85 & auVar181 | auVar89 & auVar87;
      auVar89 = *pauVar74;
      *pauVar74 = auVar89 & auVar87;
      auVar85 = *pauVar80;
      *pauVar80 = auVar85 & auVar181;
      *pauVar73 = auVar85 & auVar181 | auVar89 & auVar87;
      pauVar71 = (undefined1 (*) [16])&local_2d8;
      pauVar73 = &local_268;
      pauVar74 = &local_2b8;
      pauVar76 = &local_1f8;
      pauVar78 = &local_298;
      pauVar80 = (undefined1 (*) [16])&local_2f8;
      bVar69 = false;
    } while (bVar75);
    if ((((((((((((((((auVar84 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar84 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar84 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar84 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar84 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar84 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar84 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar84 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar84 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar84 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar84 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar84 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar84 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar84 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar84 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar84[0xf] < '\0')
    {
      lVar79 = 0;
      do {
        auVar89 = *(undefined1 (*) [16])((long)&local_98 + lVar79) & auVar84;
        *(undefined1 (*) [16])((long)&local_98 + lVar79) = auVar89;
        *(undefined1 (*) [16])(local_208 + lVar79) =
             ~auVar84 & *(undefined1 (*) [16])(local_208 + lVar79) | auVar89;
        auVar89 = *(undefined1 (*) [16])((long)&local_f8 + lVar79) & auVar84;
        *(undefined1 (*) [16])((long)&local_f8 + lVar79) = auVar89;
        *(undefined1 (*) [16])(local_278 + lVar79) =
             ~auVar84 & *(undefined1 (*) [16])(local_278 + lVar79) | auVar89;
        lVar79 = lVar79 + 0x10;
      } while (lVar79 != 0x60);
    }
  }
  puVar72 = s + -lVar70;
  lVar79 = 0;
  do {
    uVar48 = *(undefined8 *)(local_208 + lVar79 + 8);
    *(undefined8 *)puVar72 = *(undefined8 *)(local_208 + lVar79);
    *(undefined8 *)(puVar72 + 4) = uVar48;
    uVar48 = *(undefined8 *)(local_278 + lVar79 + 8);
    *(undefined8 *)s = *(undefined8 *)(local_278 + lVar79);
    *(undefined8 *)(s + 4) = uVar48;
    puVar72 = puVar72 + -lVar70;
    s = s + lVar70;
    lVar79 = lVar79 + 0x10;
  } while (lVar79 != 0x60);
  return;
}

Assistant:

void aom_highbd_lpf_horizontal_14_dual_sse2(
    uint16_t *s, int pitch, const uint8_t *_blimit0, const uint8_t *_limit0,
    const uint8_t *_thresh0, const uint8_t *_blimit1, const uint8_t *_limit1,
    const uint8_t *_thresh1, int bd) {
  __m128i p[7], q[7];
  int i;
  load_highbd_pixel(s, 7, pitch, p, q);

  highbd_lpf_internal_14_dual_sse2(p, q, _blimit0, _limit0, _thresh0, _blimit1,
                                   _limit1, _thresh1, bd);

  for (i = 0; i < 6; i++) {
    _mm_storeu_si128((__m128i *)(s - (i + 1) * pitch), p[i]);
    _mm_storeu_si128((__m128i *)(s + i * pitch), q[i]);
  }
}